

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O1

void __thiscall glu::TextureBuffer::~TextureBuffer(TextureBuffer *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if (this->m_glTexture != 0) {
    iVar1 = (*this->m_context->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x480))(1,&this->m_glTexture);
  }
  if (this->m_glBuffer != 0) {
    iVar1 = (*this->m_context->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x438))(1,&this->m_glBuffer);
  }
  de::ArrayBuffer<unsigned_char,_1UL,_1UL>::clear(&this->m_refBuffer);
  return;
}

Assistant:

TextureBuffer::~TextureBuffer (void)
{
	if (m_glTexture)
		m_context.getFunctions().deleteTextures(1, &m_glTexture);

	if (m_glBuffer)
		m_context.getFunctions().deleteBuffers(1, &m_glBuffer);
}